

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall
Diligent::GLContextState::GetBoundImage
          (GLContextState *this,Uint32 Index,GLuint *ImgHandle,GLint *MipLevel,GLboolean *IsLayered,
          GLint *Layer,GLenum *Access,GLenum *Format)

{
  pointer pBVar1;
  GLenum GVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)Index;
  pBVar1 = (this->m_BoundImages).
           super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_BoundImages).
                 super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 2) *
          0x6db6db6db6db6db7;
  if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
    *ImgHandle = 0;
    *MipLevel = 0;
    *IsLayered = '\0';
    *Layer = 0;
    *Access = 35000;
    GVar2 = 0x8814;
  }
  else {
    *ImgHandle = pBVar1[uVar4].GLHandle;
    *MipLevel = pBVar1[uVar4].MipLevel;
    *IsLayered = pBVar1[uVar4].IsLayered;
    *Layer = pBVar1[uVar4].Layer;
    *Access = pBVar1[uVar4].Access;
    GVar2 = pBVar1[uVar4].Format;
  }
  *Format = GVar2;
  return;
}

Assistant:

void GLContextState::GetBoundImage(Uint32     Index,
                                   GLuint&    ImgHandle,
                                   GLint&     MipLevel,
                                   GLboolean& IsLayered,
                                   GLint&     Layer,
                                   GLenum&    Access,
                                   GLenum&    Format) const
{
    if (Index < m_BoundImages.size())
    {
        const BoundImageInfo& BoundImg = m_BoundImages[Index];

        ImgHandle = BoundImg.GLHandle;
        MipLevel  = BoundImg.MipLevel;
        IsLayered = BoundImg.IsLayered;
        Layer     = BoundImg.Layer;
        Access    = BoundImg.Access;
        Format    = BoundImg.Format;
    }
    else
    {
        ImgHandle = 0;
        MipLevel  = 0;
        IsLayered = GL_FALSE;
        Layer     = 0;
        Access    = GL_READ_ONLY;
        // Even though image handle is null, image format must still
        // be one of the supported formats, or glBindImageTexture
        // may fail on some GLES implementations.
        // GL_RGBA32F seems to be the safest choice.
        Format = GL_RGBA32F;
    }
}